

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O1

int Extra_ThreshComputeChow(word *t,int nVars,int *pChow)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  
  iVar4 = 0;
  memset(pChow,0,(long)nVars * 4);
  if (nVars != 0x1f) {
    uVar3 = 1 << ((byte)nVars & 0x1f);
    if ((int)uVar3 < 2) {
      uVar3 = 1;
    }
    uVar2 = 0;
    iVar4 = 0;
    do {
      if ((t[uVar2 >> 6] >> (uVar2 & 0x3f) & 1) != 0) {
        iVar4 = iVar4 + 1;
        if (0 < nVars) {
          uVar5 = 0;
          do {
            if (((uint)uVar2 >> ((uint)uVar5 & 0x1f) & 1) != 0) {
              pChow[uVar5] = pChow[uVar5] + 1;
            }
            uVar5 = uVar5 + 1;
          } while ((uint)nVars != uVar5);
        }
      }
      uVar1 = (uint)uVar2 + 1;
      uVar2 = (ulong)uVar1;
    } while (uVar1 != uVar3);
  }
  if (0 < nVars) {
    uVar2 = 0;
    do {
      pChow[uVar2] = pChow[uVar2] * 2 - iVar4;
      uVar2 = uVar2 + 1;
    } while ((uint)nVars != uVar2);
  }
  return iVar4 + (-1 << ((byte)nVars - 1 & 0x1f));
}

Assistant:

int Extra_ThreshComputeChow(word * t, int nVars, int * pChow) {
    int i, k, Chow0 = 0, nMints = (1 << nVars);
    memset(pChow, 0, sizeof(int) * nVars);
    // compute Chow coefs
    for (i = 0; i < nMints; i++)
        if (Abc_TtGetBit(t, i))
            for (Chow0++, k = 0; k < nVars; k++)
                if ((i >> k) & 1)
                    pChow[k]++;
    // compute modified Chow coefs
    for (k = 0; k < nVars; k++)
        pChow[k] = 2 * pChow[k] - Chow0;
    return Chow0 - (1 << (nVars - 1));
}